

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O1

void print_statdiffr(char *prefix,char *fmt,long oldv,long newv)

{
  attr_t attr;
  wchar_t col;
  attr_t local_30;
  wchar_t local_2c;
  
  waddnstr(statuswin," ",0xffffffff);
  status_change_color_on(&local_2c,&local_30,-(long)fmt,0,-oldv,0);
  wprintw(statuswin,prefix,oldv);
  if (local_2c != L'\0') {
    wattr_off(statuswin,local_30,0);
    return;
  }
  return;
}

Assistant:

static void print_statdiffr(const char *prefix, const char *fmt,
			    long oldv, long newv)
{
    int col;
    attr_t attr;

    if (prefix && prefix[0])
	waddstr(statuswin, prefix);
    status_change_color_on(&col, &attr, -oldv, 0, -newv, 0);
    wprintw(statuswin, fmt, newv);
    status_change_color_off(col, attr);
}